

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.c
# Opt level: O0

char * strtimeex_m(void)

{
  int iVar1;
  tm *__tp;
  size_t sVar2;
  tm *timeptr;
  time_t tt;
  timeval tv;
  char sztmp [4];
  
  memset(strftimeex_m_tmpbuf,0,0x40);
  iVar1 = gettimeofday((timeval *)&tt,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    timeptr = (tm *)tt;
  }
  else {
    tt = 0;
    tv.tv_sec = 0;
    time((time_t *)&timeptr);
  }
  __tp = localtime((time_t *)&timeptr);
  if (__tp != (tm *)0x0) {
    sVar2 = strftime(strftimeex_m_tmpbuf,0x40,"%Y-%m-%d %H:%M:%S",__tp);
    if (sVar2 == 0) {
      memset(strftimeex_m_tmpbuf,0,0x40);
    }
    else {
      iVar1 = snprintf((char *)((long)&tv.tv_usec + 4),4,":%02d",tv.tv_sec / 10000 & 0xffffffff);
      if (iVar1 != 3) {
        strcpy((char *)((long)&tv.tv_usec + 4),":00");
      }
      strcat(strftimeex_fns_tmpbuf,(char *)((long)&tv.tv_usec + 4));
    }
  }
  return strftimeex_m_tmpbuf;
}

Assistant:

char* strtimeex_m(void)
{
	char sztmp[4];
	struct timeval tv;
#ifndef WINCE
	time_t tt;
	struct tm *timeptr = NULL;

	memset(strftimeex_m_tmpbuf, 0, sizeof(strftimeex_m_tmpbuf));

	if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; time(&tt); }
	else { tt = tv.tv_sec; }
	timeptr = localtime(&tt);

	if (timeptr == NULL)
	{
		return strftimeex_m_tmpbuf;
	}

	// Use strftime to build a customized time string. 
	if (strftime(
		strftimeex_m_tmpbuf,
		sizeof(strftimeex_m_tmpbuf),
		"%Y-%m-%d %H:%M:%S",
		timeptr
	) <= 0)
	{
		memset(strftimeex_m_tmpbuf, 0, sizeof(strftimeex_m_tmpbuf));
		return strftimeex_m_tmpbuf;
	}
#else
	int nb = 0;
	TCHAR* tstr = (TCHAR*)calloc(sizeof(strftimeex_m_tmpbuf), sizeof(TCHAR));

	memset(strftimeex_m_tmpbuf, 0, sizeof(strftimeex_m_tmpbuf));

	if (tstr == NULL)
	{
		return strftimeex_m_tmpbuf;
	}

	memset(tstr, 0, sizeof(strftimeex_m_tmpbuf)*sizeof(TCHAR));

	// Use GetDateFormat() and GetTimeFormat() to build a customized time string. 
	nb = GetDateFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system date.
		_T("yyyy'-'MM'-'dd' '"), // Format the string. 
		tstr,
		sizeof(strftimeex_m_tmpbuf)
	);
	if (nb <= 0)
	{
		free(tstr); tstr = NULL;
		return strftimeex_m_tmpbuf;
	}

	if (GetTimeFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system time.
		_T("HH':'mm':'ss"), // Format the string. 
		tstr+(nb-1),
		sizeof(strftimeex_m_tmpbuf)-(nb-1)
	) <= 0)
	{
		free(tstr); tstr = NULL;
		return strftimeex_m_tmpbuf;
	}

	if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

#ifdef UNICODE
	wcstombs(strftimeex_m_tmpbuf, tstr, sizeof(strftimeex_m_tmpbuf));
#else
	memcpy(strftimeex_m_tmpbuf, tstr, sizeof(strftimeex_m_tmpbuf));
#endif // UNICODE
	strftimeex_m_tmpbuf[sizeof(strftimeex_m_tmpbuf)-sizeof(sztmp)-1] = 0;
	free(tstr); tstr = NULL;
#endif // !WINCE

#ifndef DISABLE_USE_SNPRINTF
	if (snprintf(sztmp, sizeof(sztmp), ":%02d", (int)(tv.tv_usec/10000)) != 3)
#else
	if (sprintf(sztmp, ":%02d", (int)(tv.tv_usec/10000)) != 3)
#endif // DISABLE_USE_SNPRINTF
	{
		strcpy(sztmp, ":00");
	}
	strcat(strftimeex_fns_tmpbuf, sztmp);

	return strftimeex_m_tmpbuf;
}